

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O2

double __thiscall BmsBms::GetEndTime(BmsBms *this)

{
  barindex bVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  p_Var3 = (_Base_ptr)0x0;
  for (p_Var2 = (this->time_manager_).array_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->time_manager_).array_._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var4 = p_Var2[1]._M_parent;
    if ((double)p_Var2[1]._M_parent <= (double)p_Var3) {
      p_Var4 = p_Var3;
    }
    p_Var3 = p_Var4;
  }
  bVar1 = GetObjectExistsMaxBar(this);
  p_Var4 = (_Base_ptr)BmsTimeManager::GetTimeFromBar(&this->time_manager_,(double)bVar1);
  if ((double)p_Var4 <= (double)p_Var3) {
    p_Var4 = p_Var3;
  }
  return (double)p_Var4;
}

Assistant:

double BmsBms::GetEndTime() {
	double t = 0;
	for (auto it = time_manager_.Begin(); it != time_manager_.End(); ++it) {
		t = std::max(t, it->second.time);
	}
	barindex lastbar = GetObjectExistsMaxBar();
	return std::max(t, time_manager_.GetTimeFromBar(lastbar));
}